

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asserterror.h
# Opt level: O2

void __thiscall
trun::AssertError::Add
          (AssertError *this,kAssertClass aClass,int pLine,string *pFile,string *pMessage)

{
  AssertErrorItem item;
  undefined1 local_60 [40];
  string local_38 [32];
  
  local_60[0] = aClass;
  local_60._4_4_ = pLine;
  std::__cxx11::string::string((string *)(local_60 + 8),pFile);
  std::__cxx11::string::string(local_38,pMessage);
  std::
  vector<trun::AssertError::AssertErrorItem,_std::allocator<trun::AssertError::AssertErrorItem>_>::
  push_back(&this->assertErrors,(value_type *)local_60);
  AssertErrorItem::~AssertErrorItem((AssertErrorItem *)local_60);
  return;
}

Assistant:

void Add(kAssertClass aClass, int pLine, std::string pFile, std::string pMessage) {
            auto item = AssertErrorItem {
                .assertClass = aClass,
                .line = pLine,
                .file = pFile,
                .message = pMessage
            };
            assertErrors.push_back(item);
        }